

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

duration<double,_std::ratio<1L,_1L>_>
bench_cpp(int n,string_view path,string_view fname,bool verbose)

{
  string_view w;
  string_view func;
  iterator iVar1;
  variant_alternative_t<1UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool>_>
  *pvVar2;
  variant_alternative_t<0UL,_variant<basic_string<char,_char_traits<char>,_allocator<char>_>,_bool>_>
  *pvVar3;
  long lVar4;
  ostream *poVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  duration<double,_std::ratio<1L,_1L>_> dVar10;
  undefined1 local_45a;
  undefined1 local_459;
  string_view fname_local;
  rep_conflict local_438;
  string h;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  fs_function_map;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  result;
  
  fname_local._M_str = fname._M_str;
  fname_local._M_len = fname._M_len;
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_u._0_8_ = 9;
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_u._8_8_ =
       (long)"fs_canonical" + 3;
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_u._16_8_ = 0;
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_u._24_8_ = 0;
  result.
  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
  super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._32_8_ =
       std::
       _Function_handler<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/scivision[P]fortran-filesystem/app/benchmark.cpp:44:17)>
       ::_M_manager;
  std::
  _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>const*>
            ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<std::variant<std::__cxx11::string,bool>(std::basic_string_view<char,std::char_traits<char>>)>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&fs_function_map,&result,&stack0xffffffffffffffd0,0,&h,&local_459,&local_45a);
  lVar7 = 0x370;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)
               ((long)&result.
                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                       .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
                       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool> + lVar7)
              );
    lVar7 = lVar7 + -0x30;
  } while (lVar7 != -0x20);
  h._M_dataplus._M_p = (pointer)&h.field_2;
  h._M_string_length = 0;
  h.field_2._M_local_buf[0] = '\0';
  iVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&fs_function_map._M_h,&fname_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error: unknown function ");
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,fname_local._M_str,fname_local._M_len);
    std::operator<<(poVar5,"\n");
  }
  else {
    std::
    function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&result,(function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                                   ._M_cur + 0x18),path);
    if (result.
        super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
        super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
        super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
        super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
        super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_index == '\0') {
      pvVar3 = std::get<0ul,std::__cxx11::string,bool>(&result);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&h,pvVar3);
      if (h._M_string_length == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,fname_local._M_str,fname_local._M_len);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,path._M_str,path._M_len);
        bVar9 = false;
        std::operator<<(poVar5," failed on warmup\n");
        bVar6 = 0;
      }
      else {
        bVar9 = true;
        bVar6 = 0;
      }
    }
    else {
      pvVar2 = std::get<1ul,std::__cxx11::string,bool>(&result);
      bVar6 = *pvVar2;
      bVar9 = true;
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                         *)&result);
    if (bVar9) {
      iVar8 = 0;
      if (0 < n) {
        iVar8 = n;
      }
      dVar10.__r = 1.79769313486232e+308;
      while (local_438 = dVar10.__r, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        lVar7 = std::chrono::_V2::steady_clock::now();
        iVar1 = std::
                _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&fs_function_map._M_h,&fname_local);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Error: unknown function ");
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,fname_local._M_str,fname_local._M_len);
          std::operator<<(poVar5,"\n");
          goto LAB_001063f8;
        }
        std::
        function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&result,(function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>
                              *)((long)iVar1.
                                       super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                                       ._M_cur + 0x18),path);
        if (result.
            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
            .super__Move_assign_alias<std::__cxx11::basic_string<char>,_bool>.
            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_bool>.
            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_bool>.
            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_bool>._M_index == '\0') {
          pvVar3 = std::get<0ul,std::__cxx11::string,bool>(&result);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&h,pvVar3);
        }
        else {
          pvVar2 = std::get<1ul,std::__cxx11::string,bool>(&result);
          bVar6 = *pvVar2;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                             *)&result);
        lVar4 = std::chrono::_V2::steady_clock::now();
        dVar10.__r = (double)(lVar4 - lVar7) / 1000000000.0;
        if (local_438 <= dVar10.__r) {
          dVar10.__r = local_438;
        }
      }
      if (verbose) {
        func._M_str = fname_local._M_str;
        func._M_len = fname_local._M_len;
        w._M_str = h._M_dataplus._M_p;
        w._M_len = h._M_string_length;
        print_cpp((duration<double,_std::ratio<1L,_1L>_>)local_438,n,path,func,w,(bool)(bVar6 & 1));
      }
      goto LAB_001063f8;
    }
  }
  local_438 = 1.79769313486232e+308;
LAB_001063f8:
  std::__cxx11::string::~string((string *)&h);
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&fs_function_map._M_h);
  return (duration<double,_std::ratio<1L,_1L>_>)local_438;
}

Assistant:

std::chrono::duration<double> bench_cpp(int n, std::string_view path, std::string_view fname, bool verbose)
{

auto t = std::chrono::duration<double>::max();

constexpr bool strict = false;
constexpr bool expand_tilde = false;

using fs_function = std::function<std::variant<std::string, bool>(std::string_view)>;

std::unordered_map<std::string_view, fs_function> fs_function_map = {
  {"canonical", [=](std::string_view p) { return fs_canonical(p, strict, expand_tilde); }},
  {"resolve", [=](std::string_view p) { return fs_resolve(p, strict, expand_tilde); }},
  {"drop_slash", [](std::string_view p) { return fs_drop_slash(p); }},
  {"parent", [](std::string_view p) { return fs_parent(p); }},
  {"file_name", [](std::string_view p) { return fs_file_name(p); }},
  {"suffix", [](std::string_view p) { return fs_suffix(p); }},
  {"normal", [](std::string_view p) { return fs_normal(p); }},
  {"reserved", [](std::string_view p) { return fs_is_reserved(p); }},
  {"exists", [](std::string_view p) { return fs_exists(p); }},
  {"is_dir", [](std::string_view p) { return fs_is_dir(p); }},
  {"is_char", [](std::string_view p) { return fs_is_char_device(p); }},
  {"is_file", [](std::string_view p) { return fs_is_file(p); }},
  {"is_symlink", [](std::string_view p) { return fs_is_symlink(p); }},
  {"read_symlink", [](std::string_view p) { return fs_read_symlink(p); }},
  {"which", [](std::string_view p) { return fs_which(p); }},
  {"homedir", [](std::string_view) { return fs_get_homedir(); }},
  {"expanduser", [](std::string_view p) { return fs_expanduser(p); }},
  {"cwd", [](std::string_view) { return fs_get_cwd(); }},
  {"is_reserved", [](std::string_view p) { return fs_is_reserved(p); }}
};

// warmup
std::string h;
bool b = false;

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result)){
      h = std::get<std::string>(result);
      if(h.empty()){
        std::cerr << "ERROR: " << fname << " " << path << " failed on warmup\n";
        return t;
      }
    } else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

for (int i = 0; i < n; ++i)
{
  auto t0 = std::chrono::steady_clock::now();

  auto it = fs_function_map.find(fname);
  if (it != fs_function_map.end()) {
    auto result = it->second(path);
    if (std::holds_alternative<std::string>(result))
      h = std::get<std::string>(result);
    else
      b = std::get<bool>(result);
  } else {
    std::cerr << "Error: unknown function " << fname << "\n";
    return t;
  }

  auto t1 = std::chrono::steady_clock::now();
  t = std::min(t, std::chrono::duration_cast<std::chrono::duration<double>>(t1 - t0));
}

if(verbose)
  print_cpp(t, n, path, fname, h, b);

return t;
}